

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O1

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::drawIndexSample
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,
          vector<int,_std::allocator<int>_> *sample)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  undefined4 *puVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  size_type __n;
  int *__dest;
  ulong uVar12;
  size_t __n_00;
  vector<int,_std::allocator<int>_> *__n_01;
  _Any_data *this_00;
  undefined4 *__s;
  ulong uVar13;
  ulong uVar14;
  
  piVar2 = (sample->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (sample->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((long)piVar3 - (long)piVar2 != 0) {
    piVar4 = (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar5 = (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n_01 = sample;
    uVar13 = 0;
    uVar14 = 1;
    do {
      this_00 = (_Any_data *)
                (this->rng_gen_).
                super___shared_ptr<std::function<int_()>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (*(long *)(this_00 + 1) == 0) {
        std::__throw_bad_function_call();
        if (__n_01 != (vector<int,_std::allocator<int>_> *)0x0) {
          puVar8 = *(undefined4 **)(this_00->_M_pod_data + 8);
          if ((vector<int,_std::allocator<int>_> *)(*(long *)(this_00 + 1) - (long)puVar8 >> 2) <
              __n_01) {
            lVar9 = *(long *)this_00;
            __n = std::vector<int,_std::allocator<int>_>::_M_check_len
                            ((vector<int,_std::allocator<int>_> *)this_00,(size_type)__n_01,
                             "vector::_M_default_append");
            if (__n == 0) {
              __dest = (int *)0x0;
            }
            else {
              __dest = __gnu_cxx::new_allocator<int>::allocate
                                 ((new_allocator<int> *)this_00->_M_pod_data,__n,(void *)0x0);
            }
            piVar1 = __dest + ((long)puVar8 - lVar9 >> 2);
            *piVar1 = 0;
            if (__n_01 != (vector<int,_std::allocator<int>_> *)0x1) {
              memset(piVar1 + 1,0,(long)__n_01 * 4 - 4);
            }
            __n_00 = *(long *)(this_00->_M_pod_data + 8) - (long)*(void **)this_00;
            if (0 < (long)__n_00) {
              memmove(__dest,*(void **)this_00,__n_00);
            }
            if (*(void **)this_00 != (void *)0x0) {
              operator_delete(*(void **)this_00);
            }
            *(int **)this_00 = __dest;
            *(int **)(this_00->_M_pod_data + 8) = piVar1 + (long)__n_01;
            *(int **)(this_00 + 1) = __dest + __n;
          }
          else {
            *puVar8 = 0;
            __s = puVar8 + 1;
            if (__n_01 != (vector<int,_std::allocator<int>_> *)0x1) {
              memset(__s,0,(long)__n_01 * 4 - 4);
              __s = puVar8 + (long)__n_01;
            }
            *(undefined4 **)(this_00->_M_pod_data + 8) = __s;
          }
        }
        return;
      }
      piVar6 = (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar11 = (**(code **)((long)this_00 + 0x18))(this_00);
      uVar12 = (ulong)(long)iVar11 % (((long)piVar4 - (long)piVar5 >> 2) - uVar13);
      piVar7 = (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar11 = piVar6[uVar13];
      piVar6[uVar13] = piVar7[uVar12 + uVar13];
      piVar7[uVar12 + uVar13] = iVar11;
      bVar10 = uVar14 < (ulong)((long)piVar3 - (long)piVar2 >> 2);
      uVar13 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar10);
  }
  if (piVar3 == piVar2) {
    return;
  }
  memmove((sample->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start,(this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)piVar3 - (long)piVar2);
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::drawIndexSample(
    std::vector<int> & sample)
{
  size_t sample_size = sample.size();
  size_t index_size = shuffled_indices_.size();
  for( unsigned int i = 0; i < sample_size; ++i )
  {
    // The 1/(RAND_MAX+1.0) trick is when the random numbers are not uniformly
    // distributed and for small modulo elements, that does not matter
    // (and nowadays, random number generators are good)
    //std::swap (shuffled_indices_[i], shuffled_indices_[i + (rand () % (index_size - i))]);
    std::swap(
        shuffled_indices_[i],
        shuffled_indices_[i + (rnd() % (index_size - i))] );
  }
  std::copy(
      shuffled_indices_.begin(),
      shuffled_indices_.begin() + sample_size,
      sample.begin() );
}